

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex_periodic_boundary_conditions_base.h
# Opt level: O2

Vertices_iterator * __thiscall
Gudhi::cubical_complex::Bitmap_cubical_complex_periodic_boundary_conditions_base<double>::
vertices_iterator_end
          (Vertices_iterator *__return_storage_ptr__,
          Bitmap_cubical_complex_periodic_boundary_conditions_base<double> *this)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  size_t i;
  size_type __n;
  reference rVar4;
  
  Vertices_iterator::Vertices_iterator(__return_storage_ptr__,this);
  for (__n = 0; puVar2 = (this->super_Bitmap_cubical_complex_base<double>).sizes.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start,
      __n != ((ulong)((long)(this->super_Bitmap_cubical_complex_base<double>).sizes.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)puVar2) >> 2 & 0xffffffff);
      __n = __n + 1) {
    uVar1 = puVar2[__n];
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (&this->directions_in_which_periodic_b_cond_are_to_be_imposed,__n);
    (__return_storage_ptr__->counter).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[__n] =
         (ulong)((uVar1 - 1) + (uint)((rVar4._M_mask & *rVar4._M_p) == 0));
  }
  puVar3 = (__return_storage_ptr__->counter).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  *puVar3 = *puVar3 + 1;
  return __return_storage_ptr__;
}

Assistant:

Vertices_iterator vertices_iterator_end() {
    Vertices_iterator a(this);
    for (std::size_t i = 0; i != this->dimension(); ++i) {
      a.counter[i] = this->sizes[i] - this->directions_in_which_periodic_b_cond_are_to_be_imposed[i];
    }
    a.counter[0]++;
    return a;
  }